

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::TransitionOrVerifyBLASState
          (DeviceContextVkImpl *this,BottomLevelASVkImpl *BLAS,
          RESOURCE_STATE_TRANSITION_MODE TransitionMode,RESOURCE_STATE RequiredState,
          char *OperationName)

{
  int iVar1;
  undefined7 in_register_00000011;
  string msg;
  string local_40;
  
  iVar1 = (int)CONCAT71(in_register_00000011,TransitionMode);
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
          (RenderPassVkImpl *)0x0) {
        FormatString<char[55]>
                  (&local_40,(char (*) [55])"State transitions are not allowed inside a render pass"
                  );
        DebugAssertionFailed
                  (local_40._M_dataplus._M_p,"TransitionOrVerifyBLASState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xcec);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
      if ((BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_UNKNOWN) {
        TransitionBLASState(this,BLAS,RESOURCE_STATE_UNKNOWN,RequiredState,true);
      }
    }
    return;
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyBLASState
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,BLAS,RequiredState,
             OperationName);
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionOrVerifyBLASState(BottomLevelASVkImpl&           BLAS,
                                                      RESOURCE_STATE_TRANSITION_MODE TransitionMode,
                                                      RESOURCE_STATE                 RequiredState,
                                                      const char*                    OperationName)
{
    if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
        if (BLAS.IsInKnownState())
        {
            TransitionBLASState(BLAS, RESOURCE_STATE_UNKNOWN, RequiredState, true);
        }
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        DvpVerifyBLASState(BLAS, RequiredState, OperationName);
    }
#endif
}